

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall
Bstrlib::CBString::findreplace(CBString *this,CBString *sfind,CBString *repl,int pos)

{
  int iVar1;
  CBStringException *this_00;
  const_bstring local_a8;
  const_bstring local_90;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  CBStringException bstr__cppwrapper_exception;
  int pos_local;
  CBString *repl_local;
  CBString *sfind_local;
  CBString *this_local;
  
  local_90 = (const_bstring)0x0;
  if (sfind != (CBString *)0x0) {
    local_90 = &sfind->super_tagbstring;
  }
  local_a8 = (const_bstring)0x0;
  if (repl != (CBString *)0x0) {
    local_a8 = &repl->super_tagbstring;
  }
  bstr__cppwrapper_exception.msg.field_2._12_4_ = pos;
  iVar1 = bfindreplace(&this->super_tagbstring,local_90,local_a8,pos);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"CBString::Failure in findreplace",&local_71);
    CBStringException::CBStringException((CBStringException *)local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_50);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBString::findreplace (const CBString& sfind, const CBString& repl, int pos) {
	if (BSTR_ERR == bfindreplace (this, (bstring) &sfind, (bstring) &repl, pos)) {
		bstringThrow ("Failure in findreplace");
	}
}